

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseExpression(FScanner *sc,PClassActor *cls,bool mustresolve)

{
  int iVar1;
  FxExpression *pFVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  FCompileContext ctx;
  FCompileContext FStack_78;
  
  pFVar2 = ParseExpressionM(sc,cls);
  if ((int)CONCAT71(in_register_00000011,mustresolve) != 0) {
    FCompileContext::FCompileContext(&FStack_78,(PStruct *)cls,true);
    iVar1 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,&FStack_78);
    pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    TDeletingArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>::~TDeletingArray
              (&FStack_78.FunctionArgs);
  }
  return pFVar2;
}

Assistant:

FxExpression *ParseExpression (FScanner &sc, PClassActor *cls, bool mustresolve)
{
	FxExpression *data = ParseExpressionM (sc, cls);

	if (mustresolve)
	{
		FCompileContext ctx(cls, true);
		data = data->Resolve(ctx);
	}

	return data;
}